

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void setup_used_hard_regs(gen_ctx_t gen_ctx,MIR_type_t type,MIR_reg_t hard_reg)

{
  void **ppvVar1;
  bb_t *ppbVar2;
  undefined1 *puVar3;
  undefined1 auVar4 [32];
  byte bVar5;
  bitmap_t pVVar6;
  long *plVar7;
  bb_insn_t pbVar8;
  in_edge_t_conflict peVar9;
  in_edge_t peVar10;
  MIR_reg_t *pMVar11;
  HTAB_MIR_item_t *pHVar12;
  bb_t pbVar13;
  MIR_module_t pMVar14;
  VARR_MIR_reg_t *pVVar15;
  bb_t pbVar16;
  ra_ctx *prVar17;
  FILE *pFVar18;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  int iVar26;
  MIR_op_mode_t MVar27;
  MIR_type_t MVar28;
  MIR_reg_t MVar29;
  ulong extraout_RAX;
  in_edge_t peVar30;
  ulong uVar31;
  MIR_insn_t_conflict pMVar32;
  int64_t iVar33;
  MIR_insn_t_conflict insn;
  undefined1 (*pauVar34) [32];
  long *in_RCX;
  gen_ctx *pgVar35;
  MIR_context_t pMVar36;
  ulong uVar37;
  MIR_disp_t disp;
  int extraout_EDX;
  MIR_reg_t base_reg;
  gen_ctx_t pgVar38;
  long extraout_RDX;
  in_edge_t extraout_RDX_00;
  DLIST_in_edge_t *pDVar39;
  bool bVar40;
  uint uVar41;
  gen_ctx *pgVar42;
  long lVar43;
  bool bVar44;
  uint uVar45;
  undefined8 unaff_RBP;
  undefined7 uVar47;
  gen_ctx *pgVar46;
  uint uVar48;
  gen_ctx_t pgVar49;
  gen_ctx_t pgVar50;
  ulong uVar51;
  bitmap_t pVVar52;
  gen_ctx *pgVar53;
  gen_ctx *pgVar54;
  uint uVar55;
  uint *in_R8;
  gen_ctx_t pgVar56;
  gen_ctx *pgVar57;
  ulong uVar58;
  size_t sVar59;
  gen_ctx *pgVar60;
  gen_ctx *pgVar61;
  DLIST_LINK_bb_t *pDVar62;
  MIR_context_t pMVar63;
  uint *puVar64;
  ulong uVar65;
  in_edge_t_conflict peVar66;
  gen_ctx *pgVar67;
  gen_ctx *bm;
  bool bVar68;
  lr_gap_t el;
  uint uStack_37c;
  ulong uStack_360;
  int iStack_354;
  gen_ctx *pgStack_350;
  DLIST_LINK_bb_t *pDStack_348;
  uint uStack_33c;
  MIR_context_t pMStack_338;
  ulong uStack_330;
  size_t sStack_328;
  MIR_op_t MStack_320;
  uint *puStack_2e8;
  MIR_op_t MStack_2e0;
  MIR_op_t MStack_2b0;
  bb_t pbStack_280;
  bb_t pbStack_278;
  in_edge_t_conflict peStack_270;
  in_edge_t_conflict peStack_268;
  out_edge_t peStack_260;
  out_edge_t peStack_258;
  bb_insn_t pbStack_250;
  bb_insn_t pbStack_248;
  bitmap_t pVStack_240;
  bitmap_t pVStack_238;
  bitmap_t pVStack_230;
  bitmap_t pVStack_228;
  int aiStack_220 [12];
  undefined1 auStack_1f0 [16];
  undefined1 auStack_1e0 [16];
  undefined1 auStack_1d0 [16];
  gen_ctx *pgStack_188;
  gen_ctx *pgStack_180;
  MIR_context_t pMStack_178;
  in_edge_t_conflict peStack_170;
  gen_ctx *pgStack_168;
  gen_ctx *pgStack_160;
  gen_ctx_t pgStack_158;
  gen_ctx *pgStack_150;
  gen_ctx_t pgStack_148;
  in_edge_t peStack_140;
  MIR_context_t pMStack_138;
  uint uStack_130;
  uint uStack_12c;
  gen_ctx *pgStack_128;
  gen_ctx *pgStack_120;
  ulong uStack_118;
  gen_ctx *pgStack_110;
  gen_ctx *pgStack_108;
  MIR_context_t pMStack_100;
  gen_ctx_t pgStack_f8;
  gen_ctx *pgStack_f0;
  gen_ctx *pgStack_e8;
  ulong uStack_e0;
  gen_ctx *pgStack_d8;
  gen_ctx *pgStack_d0;
  MIR_context_t pMStack_c8;
  gen_ctx_t pgStack_c0;
  gen_ctx *pgStack_b8;
  gen_ctx *pgStack_b0;
  ulong uStack_a8;
  gen_ctx *pgStack_a0;
  gen_ctx *pgStack_98;
  gen_ctx *pgStack_90;
  code *pcStack_88;
  bitmap_t pVStack_78;
  gen_ctx_t pgStack_68;
  gen_ctx *pgStack_60;
  MIR_context_t pMStack_58;
  bitmap_t pVStack_50;
  gen_ctx *pgStack_48;
  code *pcStack_40;
  
  uVar47 = (undefined7)((ulong)unaff_RBP >> 8);
  bVar44 = type == MIR_T_LD && 0x21 < hard_reg;
  pgVar57 = (gen_ctx *)(ulong)hard_reg;
  pMVar36 = (MIR_context_t)0x0;
  do {
    puVar3 = (undefined1 *)
             ((long)&((bb *)(pgVar57->call_used_hard_regs + -0xd))->index + (long)&pMVar36->gen_ctx)
    ;
    if ((uint)puVar3 < 0x22) {
      pVVar6 = gen_ctx->func_used_hard_regs;
      pgVar35 = (gen_ctx *)((ulong)puVar3 & 0xffffffff);
      pgVar49 = (gen_ctx_t)((long)&pgVar35->ctx + 1);
      pcStack_40 = (code *)0x170146;
      pVVar52 = pVVar6;
      bitmap_expand(pVVar6,(size_t)pgVar49);
      if (pVVar6 == (bitmap_t)0x0) {
        pcStack_40 = get_stack_loc;
        setup_used_hard_regs_cold_1();
        sVar59 = pVVar52[0x13].size;
        pgVar50 = (gen_ctx_t)(sVar59 + 0x21);
        pgVar38 = (gen_ctx_t)((ulong)pgVar49 & 0xffffffff);
        if (pgVar38 <= pgVar50) {
          pgVar56 = (gen_ctx_t)((ulong)pgVar49 & 0xffffffff);
          uVar45 = 0xffffffff;
          pgVar54 = (gen_ctx *)0x0;
          pgVar60 = pgVar35;
          pMVar63 = pMVar36;
          pgVar67 = pgVar57;
          bVar68 = bVar44;
          goto LAB_001701c5;
        }
        uVar41 = 1;
        uVar45 = 0xffffffff;
        goto LAB_00170270;
      }
      in_RCX = (long *)(1L << ((ulong)puVar3 & 0x3f));
      *pVVar6->varr = *pVVar6->varr | (ulong)in_RCX;
    }
    bVar68 = pMVar36 != (MIR_context_t)0x0;
    pMVar36 = (MIR_context_t)((long)&pMVar36->gen_ctx + 1);
    if ((type != MIR_T_LD || 0x21 >= hard_reg) || bVar68) {
      return;
    }
  } while( true );
LAB_00170530:
  pgStack_e8 = (gen_ctx *)0x170535;
  gap_lr_spill_cost_cold_3();
LAB_00170535:
  pgStack_e8 = (gen_ctx *)0x17053a;
  gap_lr_spill_cost_cold_1();
  pgVar42 = pgVar53;
  pgStack_f8 = pgVar49;
LAB_0017053a:
  pgStack_e8 = (gen_ctx *)HTAB_lr_gap_t_do;
  gap_lr_spill_cost_cold_4();
  peVar66 = (in_edge_t_conflict)pgVar54->tied_regs;
  pgStack_148 = pgVar50;
  pgStack_110 = pgVar42;
  pgStack_108 = pgVar61;
  pMStack_100 = pMVar63;
  pgStack_f0 = bm;
  pgStack_e8 = pgVar46;
  if (peVar66 == (in_edge_t_conflict)0x0) {
    pgStack_160 = (gen_ctx *)0x1708ad;
    HTAB_lr_gap_t_do_cold_8();
    pgVar60 = pgVar35;
    pgVar49 = pgVar54;
    pgVar57 = bm;
LAB_001708ad:
    pgStack_160 = (gen_ctx *)0x1708b2;
    HTAB_lr_gap_t_do_cold_7();
LAB_001708b2:
    pgStack_160 = (gen_ctx *)0x1708b7;
    HTAB_lr_gap_t_do_cold_2();
LAB_001708b7:
    pgStack_160 = (gen_ctx *)0x1708bc;
    HTAB_lr_gap_t_do_cold_1();
    pgVar35 = pgVar42;
LAB_001708bc:
    pgStack_160 = (gen_ctx *)0x1708c1;
    HTAB_lr_gap_t_do_cold_4();
LAB_001708c1:
    pgStack_160 = (gen_ctx *)0x1708c6;
    HTAB_lr_gap_t_do_cold_6();
  }
  else {
    peVar9 = ((DLIST_in_edge_t *)&pgVar54->addr_insn_p)->head;
    pgVar60 = pgVar35;
    pgVar49 = pgVar54;
    if (peVar9 == (in_edge_t_conflict)0x0) goto LAB_001708ad;
    pgVar61 = (gen_ctx *)((ulong)pgVar35 & 0xffffffff);
    pgVar42 = (gen_ctx *)peVar66->src;
    pgVar60 = (gen_ctx *)pgVar54->curr_func_item;
    uVar41 = (int)pgVar35 - 1;
    pgVar46 = (gen_ctx *)(ulong)uVar41;
    pgStack_158 = pgVar54;
    pgStack_150 = pgVar60;
    peStack_140 = extraout_RDX_00;
    if (1 < uVar41) {
LAB_001706df:
      pgStack_160 = (gen_ctx *)0x1706f5;
      iVar26 = (*(code *)pgStack_158->debug_file)(pgStack_148,peStack_140,pgStack_150);
      uVar45 = iVar26 + (uint)(iVar26 == 0);
      pgVar49 = (gen_ctx_t)(ulong)uVar45;
      pgVar50 = pgStack_158;
      if ((in_edge_t_conflict)pgStack_158->tied_regs == (in_edge_t_conflict)0x0) goto LAB_001708b2;
      pgVar60 = (gen_ctx *)((DLIST_in_edge_t *)&pgStack_158->addr_insn_p)->head;
      uStack_130 = uVar41;
      pgStack_128 = pgVar57;
      pgStack_120 = pgVar61;
      if (pgVar60 != (gen_ctx *)0x0) {
        uVar65 = (ulong)((int)pgVar42 - 1);
        peVar30 = (((in_edge_t_conflict)pgStack_158->tied_regs)->in_link).prev;
        peVar10 = ((DLIST_LINK_in_edge_t *)&pgVar60->curr_func_item)->prev;
        pMStack_138 = (MIR_context_t)(uint *)0x0;
        uVar41 = uVar45;
        uStack_12c = uVar45;
        uStack_118 = uVar65;
        do {
          uVar41 = uVar41 & (uint)uVar65;
          puVar64 = (uint *)((long)&peVar30->src + (ulong)uVar41 * 4);
          uVar31 = (ulong)*puVar64;
          pMVar36 = (MIR_context_t)puVar64;
          if (uVar31 != 0xfffffffe) {
            if (*puVar64 == 0xffffffff) {
              if (1 < uStack_130) {
                return;
              }
              *(int *)&pgVar50->ctx = *(int *)&pgVar50->ctx + 1;
              if (pMStack_138 != (MIR_context_t)0x0) {
                puVar64 = (uint *)pMStack_138;
              }
              uVar65 = (ulong)(uint)*(size_t *)&pgVar50->optimize_level;
              *(int *)(&peVar10->src + uVar65 * 3) = (int)pgVar49;
              (&peVar10->dst)[uVar65 * 3] = (bb_t)pgStack_148;
              *(in_edge_t *)((long)&peVar10->in_link + uVar65 * 0x18) = peStack_140;
              uVar41 = (uint)*(size_t *)&pgVar50->optimize_level;
              pgVar50->optimize_level = uVar41 + 1;
              *puVar64 = uVar41;
              pgStack_128->ctx = (MIR_context_t)pgStack_148;
              *(in_edge_t *)&pgStack_128->optimize_level = peStack_140;
              return;
            }
            pMVar36 = pMStack_138;
            if (*(int *)(&peVar10->src + uVar31 * 3) == (int)pgVar49) {
              ppbVar2 = &peVar10->src + uVar31 * 3;
              pgStack_160 = (gen_ctx *)0x170790;
              iVar26 = (*(code *)((DLIST_LINK_bb_t *)&pgStack_158->debug_level)->prev)
                                 (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,
                                  pgStack_148,peStack_140,pgStack_150);
              pgVar49 = (gen_ctx_t)(ulong)uStack_12c;
              pMVar36 = pMStack_138;
              uVar65 = uStack_118;
              pgVar50 = pgStack_158;
              if (iVar26 != 0) {
                if ((int)pgStack_120 == 3) {
                  *(int *)&pgStack_158->ctx = *(int *)&pgStack_158->ctx + -1;
                  *puVar64 = 0xfffffffe;
                  if ((bb_t)pgStack_158->to_free != (bb_t)0x0) {
                    pgStack_160 = (gen_ctx *)0x17087b;
                    (*(code *)pgStack_158->to_free)
                              (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,pgStack_150)
                    ;
                  }
                  *(undefined4 *)ppbVar2 = 0;
                }
                else {
                  if ((int)pgStack_120 == 2) {
                    if ((bb_t)pgStack_158->to_free != (bb_t)0x0) {
                      pgStack_160 = (gen_ctx *)0x17083e;
                      (*(code *)pgStack_158->to_free)
                                (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,
                                 pgStack_150);
                    }
                    ppbVar2[1] = (bb_t)pgStack_148;
                    ((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev = peStack_140;
                  }
                  peVar30 = ((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev;
                  pgStack_128->ctx = (MIR_context_t)ppbVar2[1];
                  *(in_edge_t *)&pgStack_128->optimize_level = peVar30;
                }
                return;
              }
            }
          }
          uVar45 = uVar45 >> 0xb;
          uVar41 = uVar45 + 1 + uVar41 * 5;
          *(int *)&pgVar50->field_0xc = *(int *)&pgVar50->field_0xc + 1;
          pMStack_138 = pMVar36;
        } while( true );
      }
      goto LAB_001708b7;
    }
    pgVar35 = (gen_ctx *)peVar9->src;
    if ((int)*(size_t *)&pgVar54->optimize_level != (int)pgVar35) goto LAB_001706df;
    pgVar49 = (gen_ctx_t)(peVar66->in_link).prev;
    if (pgVar49 == (gen_ctx_t)0x0) goto LAB_001708c1;
    pMVar63 = (MIR_context_t)(ulong)((uint)pgVar42 * 2);
    if ((MIR_context_t)peVar66->dst != pMVar63) {
      pgVar50 = (gen_ctx_t)((long)pMVar63 * 4);
      pgStack_160 = (gen_ctx *)0x1705d1;
      pMStack_138 = pMVar63;
      peVar30 = (in_edge_t)realloc(pgVar49,(size_t)pgVar50);
      (peVar66->in_link).prev = peVar30;
      pMVar63 = pMStack_138;
    }
    peVar66->dst = (bb_t)pMVar63;
    peVar66->src = (bb_t)pMVar63;
    if ((in_edge_t_conflict)pgStack_158->tied_regs != (in_edge_t_conflict)0x0) {
      if ((int)pMVar63 != 0) {
        pgVar49 = (gen_ctx_t)(((in_edge_t_conflict)pgStack_158->tied_regs)->in_link).prev;
        pgVar50 = (gen_ctx_t)0xff;
        pgStack_160 = (gen_ctx *)0x170612;
        memset(pgVar49,0xff,(ulong)((uint)pgVar42 & 0x7fffffff) << 3);
      }
      peVar66 = ((DLIST_in_edge_t *)&pgStack_158->addr_insn_p)->head;
      if ((peVar66 != (in_edge_t_conflict)0x0) &&
         (pgVar49 = (gen_ctx_t)(peVar66->in_link).prev, pgVar49 != (gen_ctx_t)0x0)) {
        pgVar35 = (gen_ctx *)(ulong)(uint)((int)pgVar35 * 2);
        if ((gen_ctx *)peVar66->dst != pgVar35) {
          pgVar50 = (gen_ctx_t)((long)pgVar35 * 0x18);
          pgStack_160 = (gen_ctx *)0x17064d;
          peVar30 = (in_edge_t)realloc(pgVar49,(size_t)pgVar50);
          (peVar66->in_link).prev = peVar30;
        }
        peVar66->dst = (bb_t)pgVar35;
        peVar66->src = (bb_t)pgVar35;
        peVar9 = ((DLIST_in_edge_t *)&pgStack_158->addr_insn_p)->head;
        if (peVar9 == (in_edge_t_conflict)0x0) goto LAB_001708cb;
        pgVar60 = (gen_ctx *)(peVar9->in_link).prev;
        uVar45 = *(uint *)((long)&pgStack_158->ctx + 4);
        uVar48 = (uint)*(size_t *)&pgStack_158->optimize_level;
        *(undefined4 *)&pgStack_158->ctx = 0;
        pgStack_158->optimize_level = 0;
        *(undefined4 *)((long)&pgStack_158->ctx + 4) = 0;
        if (uVar45 < uVar48) {
          peVar66 = (in_edge_t_conflict)((long)&pgVar60->curr_func_item + (ulong)uVar45 * 0x18);
          lVar43 = (ulong)uVar48 - (ulong)uVar45;
          pgVar49 = pgStack_158;
          do {
            if (*(int *)((long)peVar66 + -0x10) != 0) {
              pgStack_160 = (gen_ctx *)0x1706b0;
              el.lr = *(live_range_t_conflict *)peVar66;
              el._0_8_ = *(undefined8 *)((long)peVar66 + -8);
              HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar49,el,HTAB_INSERT,(lr_gap_t *)pgVar57);
              pgVar60 = *(gen_ctx **)peVar66;
              pgStack_160 = (gen_ctx *)0x1706ca;
              (*(code *)((DLIST_LINK_bb_t *)&pgStack_158->debug_level)->prev)
                        ((gen_ctx *)pgVar57->ctx,*(c2mir_ctx **)&pgVar57->optimize_level,
                         *(undefined8 *)((long)peVar66 + -8),pgVar60,pgStack_150);
              pgVar49 = pgStack_158;
            }
            peVar66 = (in_edge_t_conflict)((long)peVar66 + 0x18);
            lVar43 = lVar43 + -1;
          } while (lVar43 != 0);
        }
        pgVar42 = (gen_ctx *)((ulong)pMVar63 & 0xffffffff);
        goto LAB_001706df;
      }
      goto LAB_001708bc;
    }
  }
  pgStack_160 = (gen_ctx *)0x1708cb;
  HTAB_lr_gap_t_do_cold_5();
LAB_001708cb:
  pgStack_160 = (gen_ctx *)rewrite_insn;
  HTAB_lr_gap_t_do_cold_3();
  pMVar36 = pgVar49->ctx;
  uStack_330 = 0;
  pgStack_188 = pgVar35;
  pgStack_180 = pgVar61;
  pMStack_178 = pMVar63;
  peStack_170 = peVar66;
  pgStack_168 = pgVar57;
  pgStack_160 = pgVar46;
  MIR_new_int_op(pMVar36,0);
  MIR_new_int_op(pMVar36,0);
  sStack_328 = MIR_insn_nops(pMVar36,(MIR_insn_t_conflict)pgVar50);
  pDStack_348 = (DLIST_LINK_bb_t *)&pgVar50->debug_level;
  puStack_2e8 = (uint *)((long)&((DLIST_out_edge_t *)&pgVar50->addr_regs)->head + 4);
  uStack_37c = 0xffffffff;
  uStack_33c = 0xffffffff;
  iVar26 = 0;
  pgStack_350 = pgVar60;
  pMStack_338 = pMVar36;
LAB_00170986:
  if (sStack_328 != 0) {
    sVar59 = 0;
    puVar64 = puStack_2e8;
    do {
      MVar27 = MIR_insn_op_mode(pMVar36,(MIR_insn_t_conflict)pgVar50,sVar59,&iStack_354);
      pgVar57 = pgStack_350;
      if (((iVar26 != 0) || ((iStack_354 != 0 && ((char)puVar64[-7] != '\v')))) &&
         ((iStack_354 == 0 || iVar26 != 1 || ((char)puVar64[-7] == '\v')))) {
        if ((char)puVar64[-7] == '\v') {
          uVar65 = (ulong)puVar64[-1];
          if (uVar65 < 0x22) {
            pVVar6 = pgVar49->func_used_hard_regs;
            bitmap_expand(pVVar6,uVar65 + 1);
            if (pVVar6 == (bitmap_t)0x0) goto LAB_001720bd;
            *pVVar6->varr = *pVVar6->varr | 1L << (uVar65 & 0x3f);
          }
          uVar65 = (ulong)*puVar64;
          if (uVar65 < 0x22) {
            pVVar6 = pgVar49->func_used_hard_regs;
            bitmap_expand(pVVar6,uVar65 + 1);
            if (pVVar6 == (bitmap_t)0x0) goto LAB_001720c2;
            *pVVar6->varr = *pVVar6->varr | 1L << (uVar65 & 0x3f);
          }
          uVar41 = puVar64[-1];
          uVar65 = (ulong)uVar41;
          if (uVar65 != 0xffffffff) {
            uVar45 = *puVar64;
            if (uVar45 - 0x22 < 0xffffffdd && 0x21 < uVar41) {
              pVVar15 = pgVar49->ra_ctx->reg_renumber;
              if (((pVVar15 == (VARR_MIR_reg_t *)0x0) ||
                  (pMVar11 = pVVar15->varr, pMVar11 == (MIR_reg_t *)0x0)) ||
                 (pVVar15->els_num <= uVar65)) goto LAB_001720ae;
              if (0x21 < pMVar11[uVar65]) {
                if (pVVar15->els_num <= (ulong)uVar45) goto LAB_001720db;
                if (0x21 < pMVar11[uVar45]) {
                  if (iStack_354 == 0) {
                    bVar44 = -1 < (int)uStack_37c;
                    uVar48 = uStack_33c;
                    uVar55 = uStack_33c;
                    uStack_37c = (uint)sVar59;
                    if (bVar44) {
                      __assert_fail("in_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5f,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  else {
                    uVar48 = uStack_37c;
                    uVar55 = (uint)sVar59;
                    if (-1 < (int)uStack_33c) {
                      __assert_fail("out_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5b,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  uStack_33c = uVar55;
                  if ((((int)uVar48 < 0) ||
                      (uVar41 != *(uint *)&pDStack_348[(ulong)uVar48 * 3 + 2].prev)) ||
                     (uVar45 != *(uint *)((long)&pDStack_348[(ulong)uVar48 * 3 + 2].prev + 4))) {
                    uStack_330 = (ulong)((int)uStack_330 + 2);
                  }
                }
              }
            }
          }
          if (pgStack_350 != (gen_ctx *)0x0) {
            if (uVar41 != 0xffffffff) {
              update_live(uVar41,0,(bitmap_t)*(bb_t *)&pgStack_350->optimize_level);
              uVar65 = (ulong)puVar64[-1];
              if (0x21 < uVar65) {
                peVar30 = ((DLIST_LINK_in_edge_t *)&pgStack_350->curr_func_item)->prev;
                if (peVar30 == (in_edge_t)0x0) goto LAB_001720d6;
                if ((uVar65 < (ulong)((long)peVar30->src << 6)) &&
                   (peVar30 = (peVar30->in_link).prev, uVar41 = puVar64[-1] >> 6,
                   pbVar13 = (&peVar30->src)[uVar41],
                   (&peVar30->src)[uVar41] = (bb_t)((ulong)pbVar13 & ~(1L << (uVar65 & 0x3f))),
                   ((ulong)pbVar13 >> (uVar65 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(pgVar49,puVar64[-1],base_reg,(MIR_insn_t)pgVar50,1,0);
                }
              }
            }
            pgVar57 = pgStack_350;
            pMVar36 = pMStack_338;
            if (*puVar64 != 0xffffffff) {
              update_live(*puVar64,0,(bitmap_t)*(bb_t *)&pgStack_350->optimize_level);
              pMVar36 = pMStack_338;
              uVar65 = (ulong)*puVar64;
              if (0x21 < uVar65) {
                peVar30 = ((DLIST_LINK_in_edge_t *)&pgVar57->curr_func_item)->prev;
                if (peVar30 == (in_edge_t)0x0) goto LAB_001720d1;
                if ((uVar65 < (ulong)((long)peVar30->src << 6)) &&
                   (peVar30 = (peVar30->in_link).prev, uVar41 = *puVar64 >> 6,
                   pbVar13 = (&peVar30->src)[uVar41],
                   (&peVar30->src)[uVar41] = (bb_t)((ulong)pbVar13 & ~(1L << (uVar65 & 0x3f))),
                   ((ulong)pbVar13 >> (uVar65 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(pgVar49,*puVar64,base_reg,(MIR_insn_t)pgVar50,1,0);
                }
              }
            }
          }
        }
        else if ((char)puVar64[-7] == '\x02') {
          uVar65 = (ulong)puVar64[-5];
          if (uVar65 < 0x22) {
            pVVar6 = pgVar49->func_used_hard_regs;
            bitmap_expand(pVVar6,uVar65 + 1);
            if (pVVar6 == (bitmap_t)0x0) goto LAB_001720b8;
            *pVVar6->varr = *pVVar6->varr | 1L << (uVar65 & 0x3f);
            if (pgStack_350 != (gen_ctx *)0x0) {
              update_live(puVar64[-5],iStack_354,(bitmap_t)*(bb_t *)&pgStack_350->optimize_level);
            }
          }
          else {
            if (iStack_354 == 0) {
              pVVar15 = pgVar49->ra_ctx->reg_renumber;
              if (((pVVar15 == (VARR_MIR_reg_t *)0x0) || (pVVar15->varr == (MIR_reg_t *)0x0)) ||
                 (pVVar15->els_num <= uVar65)) goto LAB_001720b3;
              if (0x21 < pVVar15->varr[uVar65]) {
                uStack_330 = (ulong)((int)uStack_330 + (uint)(MVar27 - MIR_OP_REF < 0xfffffffd));
              }
            }
            pMVar36 = pMStack_338;
            if (pgStack_350 != (gen_ctx *)0x0) {
              update_live(puVar64[-5],iStack_354,(bitmap_t)*(bb_t *)&pgStack_350->optimize_level);
              pMVar36 = pMStack_338;
              peVar30 = ((DLIST_LINK_in_edge_t *)&pgVar57->curr_func_item)->prev;
              if (peVar30 == (in_edge_t)0x0) goto LAB_001720cc;
              uVar65 = (ulong)puVar64[-5];
              if ((uVar65 < (ulong)((long)peVar30->src << 6)) &&
                 (peVar30 = (peVar30->in_link).prev, uVar41 = puVar64[-5] >> 6,
                 pbVar13 = (&peVar30->src)[uVar41],
                 (&peVar30->src)[uVar41] = (bb_t)((ulong)pbVar13 & ~(1L << (uVar65 & 0x3f))),
                 ((ulong)pbVar13 >> (uVar65 & 0x3f) & 1) != 0)) {
                spill_restore_reg(pgVar49,puVar64[-5],base_reg,(MIR_insn_t)pgVar50,1,0);
              }
            }
          }
        }
      }
      sVar59 = sVar59 + 1;
      puVar64 = puVar64 + 0xc;
    } while (sStack_328 != sVar59);
  }
  pgVar57 = pgStack_350;
  if (iVar26 != 0 || pgStack_350 == (gen_ctx *)0x0) goto LAB_00171238;
  target_get_early_clobbered_hard_regs
            ((MIR_insn_t)pgVar50,(MIR_reg_t *)&MStack_2b0,(MIR_reg_t *)&MStack_2e0);
  if ((MIR_reg_t)MStack_2b0.data != 0xffffffff) {
    update_live((MIR_reg_t)MStack_2b0.data,1,(bitmap_t)*(bb_t *)&pgVar57->optimize_level);
  }
  if ((MIR_reg_t)MStack_2e0.data != 0xffffffff) {
    update_live((MIR_reg_t)MStack_2e0.data,1,(bitmap_t)*(bb_t *)&pgVar57->optimize_level);
  }
  if (*(int *)&pgVar50->debug_file - 0xaaU < 0xfffffffd) goto LAB_00171238;
  pVVar6 = pgVar49->call_used_hard_regs[0x12];
  if (pVVar6 != (bitmap_t)0x0) {
    pMVar63 = pgVar50->ctx;
    uVar65 = 0;
    do {
      pgVar57 = pgStack_350;
      uVar37 = uVar65 >> 6;
      uVar31 = pVVar6->els_num;
      bVar44 = true;
      uVar51 = uVar65;
      if (uVar37 < uVar31) {
        uVar51 = uVar31 << 6;
LAB_00170f18:
        if ((pVVar6->varr[uVar37] == 0) ||
           (uVar58 = pVVar6->varr[uVar37] >> (uVar65 & 0x3f), uVar58 == 0)) goto LAB_00170f2b;
        uVar31 = uVar58 & 1;
        uStack_360 = uVar65;
        while (uVar31 == 0) {
          uStack_360 = uStack_360 + 1;
          uVar31 = uVar58 & 2;
          uVar58 = uVar58 >> 1;
        }
        uVar51 = uStack_360 + 1;
        bVar44 = false;
      }
LAB_00170f64:
      if (bVar44) goto LAB_00170f94;
      update_live((MIR_reg_t)uStack_360,1,(bitmap_t)*(bb_t *)&pgStack_350->optimize_level);
      uVar65 = uVar51;
      if (pVVar6 == (bitmap_t)0x0) break;
    } while( true );
  }
  rewrite_insn_cold_16();
  goto LAB_0017209a;
LAB_00170f2b:
  uVar37 = uVar37 + 1;
  uVar65 = uVar37 * 0x40;
  if (uVar31 == uVar37) goto LAB_00170f64;
  goto LAB_00170f18;
LAB_00170f94:
  pHVar12 = pMVar63->module_item_tab;
  if (pHVar12 != (HTAB_MIR_item_t *)0x0) {
    uVar65 = 0;
    do {
      uVar37 = uVar65 >> 6;
      uVar31._0_4_ = pHVar12->els_num;
      uVar31._4_4_ = pHVar12->els_start;
      bVar44 = true;
      uVar51 = uVar65;
      if (uVar37 < uVar31) {
        uVar51 = uVar31 << 6;
LAB_00170fc9:
        uVar58 = *(ulong *)((long)pHVar12->arg + uVar37 * 8);
        if ((uVar58 == 0) || (uVar58 = uVar58 >> (uVar65 & 0x3f), uVar58 == 0)) goto LAB_00170fdc;
        uVar31 = uVar58 & 1;
        uStack_360 = uVar65;
        while (uVar31 == 0) {
          uStack_360 = uStack_360 + 1;
          uVar31 = uVar58 & 2;
          uVar58 = uVar58 >> 1;
        }
        uVar51 = uStack_360 + 1;
        bVar44 = false;
      }
LAB_00171015:
      if (bVar44) goto LAB_0017103a;
      update_live((MIR_reg_t)uStack_360,0,(bitmap_t)*(bb_t *)&pgVar57->optimize_level);
      uVar65 = uVar51;
      if (pHVar12 == (HTAB_MIR_item_t *)0x0) break;
    } while( true );
  }
LAB_0017209a:
  rewrite_insn_cold_15();
LAB_0017209f:
  rewrite_insn_cold_14();
LAB_001720a4:
  rewrite_insn_cold_12();
LAB_001720a9:
  rewrite_insn_cold_13();
LAB_001720ae:
  rewrite_insn_cold_2();
LAB_001720b3:
  rewrite_insn_cold_8();
LAB_001720b8:
  rewrite_insn_cold_9();
LAB_001720bd:
  rewrite_insn_cold_6();
LAB_001720c2:
  rewrite_insn_cold_5();
LAB_001720c7:
  rewrite_insn_cold_11();
LAB_001720cc:
  rewrite_insn_cold_7();
LAB_001720d1:
  rewrite_insn_cold_4();
LAB_001720d6:
  rewrite_insn_cold_3();
LAB_001720db:
  rewrite_insn_cold_1();
LAB_001720e0:
  rewrite_insn_cold_10();
  goto LAB_001720e5;
LAB_00170fdc:
  uVar37 = uVar37 + 1;
  uVar65 = uVar37 * 0x40;
  if (uVar31 == uVar37) goto LAB_00171015;
  goto LAB_00170fc9;
LAB_0017103a:
  pbVar13 = *(bb_t *)&pgVar57->optimize_level;
  if (pbVar13 != (bb_t)0x0) {
    uVar65 = 0;
    do {
      uVar37 = uVar65 >> 6;
      uVar31 = pbVar13->index;
      bVar44 = true;
      uVar51 = uVar65;
      if (uVar37 < uVar31) {
        uVar51 = uVar31 << 6;
LAB_00171068:
        uVar58 = *(ulong *)(pbVar13->rpost + uVar37 * 8);
        if ((uVar58 == 0) || (uVar58 = uVar58 >> (uVar65 & 0x3f), uVar58 == 0)) goto LAB_0017107b;
        uVar31 = uVar58 & 1;
        uStack_360 = uVar65;
        while (uVar31 == 0) {
          uStack_360 = uStack_360 + 1;
          uVar31 = uVar58 & 2;
          uVar58 = uVar58 >> 1;
        }
        uVar51 = uStack_360 + 1;
        bVar44 = false;
      }
LAB_001710b4:
      if (bVar44) goto LAB_00171238;
      if (0x21 < uStack_360) {
        pMVar14 = (pgStack_350->ctx->environment_module).module_link.next;
        if (pMVar14 == (MIR_module_t)0x0) goto LAB_001720a9;
        uVar65 = uStack_360 & 0xffffffff;
        if (((ulong)((long)pMVar14->data << 6) <= uVar65) ||
           (((ulong)(&((pMVar14->items).head)->data)[(uint)uStack_360 >> 6] >> (uStack_360 & 0x3f) &
            1) == 0)) {
          pVVar15 = pgVar49->ra_ctx->reg_renumber;
          if ((pVVar15 == (VARR_MIR_reg_t *)0x0) ||
             ((pVVar15->varr == (MIR_reg_t *)0x0 || (pVVar15->els_num <= uVar65))))
          goto LAB_001720a4;
          uVar31 = (ulong)pVVar15->varr[uVar65];
          if (uVar31 < 0x22) {
            MIR_reg_type(pgVar49->ctx,(uint)uStack_360 - 0x21,(pgVar49->curr_func_item->u).func);
            pMVar36 = pMStack_338;
            pVVar6 = pgVar49->call_used_hard_regs[0x12];
            if (pVVar6 == (bitmap_t)0x0) goto LAB_001720c7;
            if ((uVar31 < pVVar6->els_num << 6) && ((*pVVar6->varr >> (uVar31 & 0x3f) & 1) != 0)) {
              peVar30 = ((DLIST_LINK_in_edge_t *)&pgStack_350->curr_func_item)->prev;
              bitmap_expand((bitmap_t)peVar30,uVar65 + 1);
              if (peVar30 == (in_edge_t)0x0) goto LAB_001720e0;
              peVar30 = (peVar30->in_link).prev;
              pbVar16 = (&peVar30->src)[(uint)uStack_360 >> 6];
              (&peVar30->src)[(uint)uStack_360 >> 6] =
                   (bb_t)((ulong)pbVar16 | 1L << (uStack_360 & 0x3f));
              if (((ulong)pbVar16 >> (uStack_360 & 0x3f) & 1) == 0) {
                spill_restore_reg(pgVar49,(uint)uStack_360,base_reg,(MIR_insn_t)pgVar50,1,1);
              }
            }
          }
        }
      }
      uVar65 = uVar51;
      if (pbVar13 == (bb_t)0x0) break;
    } while( true );
  }
  goto LAB_0017209f;
LAB_0017107b:
  uVar37 = uVar37 + 1;
  uVar65 = uVar37 * 0x40;
  if (uVar31 == uVar37) goto LAB_001710b4;
  goto LAB_00171068;
LAB_00171238:
  bVar44 = iVar26 != 0;
  iVar26 = iVar26 + 1;
  if (bVar44) goto code_r0x00171245;
  goto LAB_00170986;
LAB_001701c5:
  do {
    uVar55 = (uint)pgVar56;
    bVar40 = 0x21 < uVar55 && extraout_EDX == 10;
    uVar48 = (uint)bVar40;
    uVar41 = uVar48 + 1;
    pgVar38 = (gen_ctx_t)(ulong)(uVar55 + bVar40);
    if (pgVar50 < pgVar38) break;
    if (in_RCX == (long *)0x0) {
      pcStack_88 = available_hreg_p;
      pVStack_78 = pVVar52;
      pgStack_68 = gen_ctx;
      pgStack_60 = pgVar35;
      pMStack_58 = pMVar36;
      pVStack_50 = pVVar6;
      pgStack_48 = pgVar57;
      pcStack_40._0_1_ = bVar44;
      pcStack_40._1_7_ = uVar47;
      get_stack_loc_cold_1();
      iVar26 = (int)in_RCX[1];
      pgVar57 = (gen_ctx *)(long)iVar26;
      iVar25 = *(int *)((long)in_RCX + 0xc);
      pgVar35 = (gen_ctx *)(long)iVar25;
      if (iVar25 < iVar26) {
        return;
      }
      pgVar53 = (gen_ctx *)(long)(int)pgVar50;
      uVar48 = (int)pgVar50 + 1;
      pgVar42 = (gen_ctx *)(1L << ((ulong)uVar48 & 0x3f));
      uVar45 = (iVar25 - iVar26) + 1;
      pgVar61 = pgVar60;
      bm = pgVar67;
      while( true ) {
        pgVar46 = (gen_ctx *)(ulong)uVar45;
        plVar7 = *(long **)(extraout_RDX + (long)pgVar57 * 8);
        if (plVar7 == (long *)0x0) break;
        bm = (gen_ctx *)(*plVar7 << 6);
        if ((pgVar53 < bm) &&
           (pgVar61 = (gen_ctx *)plVar7[2],
           ((ulong)pgVar61->call_used_hard_regs[((ulong)pgVar53 >> 6) - 0xd] &
           1L << ((ulong)pgVar53 & 0x3f)) != 0)) {
          return;
        }
        if (1 < (int)pgVar49) {
          if (0x21 < uVar48) {
            return;
          }
          if (((gen_ctx *)(ulong)uVar48 < bm) && ((*(ulong *)plVar7[2] & (ulong)pgVar42) != 0)) {
            return;
          }
        }
        pgVar57 = (gen_ctx *)((long)&pgVar57->ctx + 1);
        uVar45 = uVar45 - 1;
        if (uVar45 == 0) {
          return;
        }
      }
      pgStack_b0 = (gen_ctx *)gap_lr_spill_cost;
      uStack_a8 = (ulong)uVar41;
      pgStack_a0 = pgVar60;
      pgStack_98 = pgVar54;
      pgStack_90 = pgVar67;
      pcStack_88._0_1_ = bVar68;
      pcStack_88._1_7_ = uVar47;
      available_hreg_p_cold_1();
      pbVar8 = (bb_insn_t)((MIR_module *)&pgVar53->temp_bitmap)->data;
      pgStack_c0 = (gen_ctx_t)0x0;
      pgVar50 = pgVar49;
      pgVar54 = pgVar53;
      pgStack_f8 = pgStack_c0;
      uStack_e0 = extraout_RAX;
      pgStack_d8 = pgVar42;
      pgStack_d0 = pgVar61;
      pMStack_c8 = pMVar63;
      pgStack_b8 = bm;
      pgStack_b0 = pgVar46;
      if ((pbVar8 != (bb_insn_t)0x0) && (*(long *)&pbVar8->mem_index != 0)) {
        pbVar8->insn = (MIR_insn_t)0x0;
        pgVar61 = (gen_ctx *)pgVar49->ctx;
        if (pgVar61 == (gen_ctx *)0x0) {
LAB_00170401:
          pMVar63 = pgVar49->ctx;
          if (pMVar63 != (MIR_context_t)0x0) {
            uStack_e0 = 0;
            do {
              pgVar61 = pMVar63->gen_ctx;
              pgStack_e8 = (gen_ctx *)0x170421;
              pgVar54 = pgVar61;
              uVar41 = bb_loop_level((bb_t_conflict)pgVar61);
              bm = (gen_ctx *)(ulong)uVar41;
              pgVar46 = (gen_ctx *)0xffffffff;
              for (pgVar49 = (gen_ctx_t)((DLIST_out_edge_t *)&pgVar61->addr_regs)->head;
                  iVar26 = (int)pgVar46, pgVar49 != (gen_ctx_t)0x0;
                  pgVar49 = (gen_ctx_t)pgVar49->to_free) {
                pbVar8 = (bb_insn_t)((MIR_module *)&pgVar53->temp_bitmap)->data;
                if (pbVar8 == (bb_insn_t)0x0) {
                  pgStack_e8 = (gen_ctx *)0x170530;
                  gap_lr_spill_cost_cold_2();
                  goto LAB_00170530;
                }
                pgVar54 = (gen_ctx *)((DLIST_LINK_MIR_insn_t *)&pgVar49->optimize_level)->prev;
                pgVar35 = (gen_ctx *)pgVar54->ctx;
                if (((gen_ctx *)((long)pbVar8->insn << 6) <= pgVar35) ||
                   ((*(ulong *)(*(long *)&pbVar8->mem_index + ((ulong)pgVar35 >> 6) * 8) >>
                     ((ulong)pgVar35 & 0x3f) & 1) == 0)) {
                  pgStack_e8 = (gen_ctx *)0x17046d;
                  iVar25 = bb_loop_level((bb_t_conflict)pgVar54);
                  pgVar35 = (gen_ctx *)(ulong)(iVar25 + 1U);
                  if (iVar26 <= iVar25) {
                    pgVar46 = (gen_ctx *)(ulong)(iVar25 + 1U);
                  }
                }
              }
              uVar41 = uVar41 + 1;
              bm = (gen_ctx *)(ulong)uVar41;
              if (-1 < iVar26) {
                if ((int)uVar41 <= iVar26) {
                  pgVar46 = bm;
                }
                uStack_e0 = (ulong)(uint)((int)uStack_e0 + (int)pgVar46 * 2);
              }
              pgVar46 = (gen_ctx *)0xffffffff;
              for (pgVar49 = (gen_ctx_t)((DLIST_in_edge_t *)&pgVar61->addr_insn_p)->head;
                  uVar45 = (uint)pgVar46, pgVar49 != (gen_ctx_t)0x0;
                  pgVar49 = (gen_ctx_t)pgVar49->debug_file) {
                pbVar8 = (bb_insn_t)((MIR_module *)&pgVar53->temp_bitmap)->data;
                if (pbVar8 == (bb_insn_t)0x0) goto LAB_00170530;
                pgVar54 = (gen_ctx *)pgVar49->ctx;
                pgVar35 = (gen_ctx *)pgVar54->ctx;
                if (((gen_ctx *)((long)pbVar8->insn << 6) <= pgVar35) ||
                   ((*(ulong *)(*(long *)&pbVar8->mem_index + ((ulong)pgVar35 >> 6) * 8) >>
                     ((ulong)pgVar35 & 0x3f) & 1) == 0)) {
                  pgStack_e8 = (gen_ctx *)0x1704dc;
                  iVar26 = bb_loop_level((bb_t_conflict)pgVar54);
                  pgVar35 = (gen_ctx *)(ulong)(iVar26 + 1U);
                  if ((int)uVar45 <= iVar26) {
                    pgVar46 = (gen_ctx *)(ulong)(iVar26 + 1U);
                  }
                }
              }
              if (-1 < (int)uVar45) {
                if ((int)uVar45 < (int)uVar41) {
                  uVar41 = uVar45;
                }
                uStack_e0 = (ulong)((int)uStack_e0 + uVar41 * 2);
              }
              pMVar63 = (MIR_context_t)pMVar63->c2mir_ctx;
            } while (pMVar63 != (MIR_context_t)0x0);
          }
          return;
        }
        pMVar63 = (MIR_context_t)&DAT_00000001;
        while( true ) {
          bm = (gen_ctx *)((MIR_module *)&pgVar53->temp_bitmap)->data;
          pgVar46 = (gen_ctx *)((gen_ctx *)pgVar61->ctx)->ctx;
          pgVar50 = (gen_ctx_t)((long)&pgVar46->ctx + 1);
          pgStack_e8 = (gen_ctx *)0x1703da;
          pgVar54 = bm;
          bitmap_expand((bitmap_t)bm,(size_t)pgVar50);
          if (bm == (gen_ctx *)0x0) break;
          pgVar35 = (gen_ctx *)((ulong)pgVar46 >> 6);
          ppvVar1 = &bm->curr_func_item->data + (long)pgVar35;
          *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)pgVar46 & 0x3f));
          pgVar61 = *(gen_ctx **)&pgVar61->optimize_level;
          if (pgVar61 == (gen_ctx *)0x0) goto LAB_00170401;
        }
        goto LAB_00170535;
      }
      goto LAB_0017053a;
    }
    pgVar38 = (gen_ctx_t)(*in_RCX << 6);
    pgVar54 = (gen_ctx *)(ulong)uVar41;
    pgVar67 = (gen_ctx *)-(long)pgVar54;
    bVar68 = true;
    pgVar60 = (gen_ctx *)&DAT_00000001;
    pgVar49 = pgVar56;
    do {
      if ((pgVar49 < pgVar38) &&
         (pMVar63 = (MIR_context_t)((ulong)pgVar49 >> 6),
         (*(ulong *)(in_RCX[2] + (long)pMVar63 * 8) >> ((ulong)pgVar49 & 0x3f) & 1) != 0)) {
        if (bVar68 != false) goto LAB_00170261;
        break;
      }
      bVar68 = pgVar60 < pgVar54;
      pgVar49 = (gen_ctx_t)(ulong)((int)pgVar49 + 1);
      puVar3 = (undefined1 *)((long)&pgVar67->ctx + 1) + (long)pgVar60;
      pgVar60 = (gen_ctx *)((long)&pgVar60->ctx + 1);
    } while (puVar3 != &DAT_00000001);
    uVar48 = uVar48 & uVar55 - 0x22;
    pgVar49 = (gen_ctx_t)(ulong)uVar48;
    uVar48 = ~uVar45 | uVar48;
    pgVar38 = (gen_ctx_t)(ulong)uVar48;
    if (uVar48 == 0) {
      uVar45 = uVar55;
    }
LAB_00170261:
    pgVar56 = (gen_ctx_t)(ulong)(uVar55 + 1);
  } while (pgVar56 <= pgVar50);
LAB_00170270:
  if (uVar45 == 0xffffffff) {
    uVar45 = 0;
    uVar41 = 1;
    do {
      bVar44 = uVar45 != 0;
      uVar48 = (uint)sVar59 + 0x22;
      uVar45 = ((uint)sVar59 < 0xffffffde && extraout_EDX == 10) + 1;
      if (bVar44) {
        uVar48 = (uint)pgVar38;
        uVar45 = uVar41;
      }
      uVar41 = uVar45;
      uVar45 = 2;
      if (!bVar44) {
        uVar45 = (uint)((uVar48 - 0x22) % uVar41 == 0);
      }
      sVar59 = sVar59 + 1;
      pgVar38 = (gen_ctx_t)(ulong)uVar48;
    } while (uVar45 < uVar41);
    pVVar52[0x13].size = sVar59;
  }
  *in_R8 = uVar41;
  return;
code_r0x00171245:
  prVar17 = pgVar49->ra_ctx;
  prVar17->in_reloads_num = 0;
  prVar17->out_reloads_num = 0;
  if ((int)uStack_330 < 3) {
LAB_0017165a:
    bVar44 = *(int *)&pgVar50->debug_file - 0x22U < 0xfffffffc;
    if (!bVar44) {
      if (bVar44) {
        __assert_fail("MIR_addr_code_p (insn->code)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f03,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      if (*(char *)&pgVar50->temp_bitmap2 != '\x02') {
        __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar41 = *(uint *)&pgVar50->temp_bitmap3;
      if (0xffffffdc < uVar41 - 0x22) {
        __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      pVVar15 = pgVar49->ra_ctx->reg_renumber;
      if (((pVVar15 == (VARR_MIR_reg_t *)0x0) || (pVVar15->varr == (MIR_reg_t *)0x0)) ||
         (pVVar15->els_num <= (ulong)uVar41)) goto LAB_00172195;
      pMVar36 = pgVar49->ctx;
      uVar45 = pVVar15->varr[uVar41];
      MVar28 = MIR_reg_type(pMVar36,uVar41 - 0x21,(pgVar49->curr_func_item->u).func);
      if (uVar45 < 0x22) {
        __assert_fail("loc > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar45 = uVar45 - 0x22;
      if (pgVar49->target_ctx->keep_fp_p == '\0') {
        lVar43 = (ulong)uVar45 << 3;
      }
      else {
        lVar43 = -0xb0;
        if (((pgVar49->curr_func_item->u).func)->vararg_p == '\0') {
          lVar43 = 0;
        }
        lVar43 = lVar43 + (ulong)((MVar28 == MIR_T_LD) + 1 + uVar45) * -8;
      }
      MVar29 = get_reload_hreg(pgVar49,0xffffffff,6,0);
      _MIR_new_var_op(pMVar36,MVar29);
      iVar33 = _MIR_addr_offset(pMVar36,*(MIR_insn_code_t *)&pgVar50->debug_file);
      MIR_new_int_op(pMVar36,lVar43 + iVar33);
      pMVar32 = MIR_new_insn(pMVar36,MIR_MOV);
      _MIR_new_var_op(pMVar36,MVar29);
      _MIR_new_var_op(pMVar36,MVar29);
      _MIR_new_var_op(pMVar36,base_reg);
      insn = MIR_new_insn(pMVar36,MIR_ADD);
      if (((FILE *)pgVar49->debug_file != (FILE *)0x0) && (1 < pgVar49->debug_level)) {
        if (pgVar49->optimize_level == 0) {
          uVar41 = *(int *)&pgVar50->debug_file - 0xa7;
          pgVar38 = pgVar50;
          if ((uVar41 < 0xe) && ((0x2007U >> (uVar41 & 0x1f) & 1) != 0)) {
            pgVar38 = (gen_ctx_t)pgVar50->ctx;
          }
        }
        else {
          pgVar38 = (gen_ctx_t)&pgVar50->ctx->temp_string;
        }
        fprintf((FILE *)pgVar49->debug_file,"    Adding before insn (in BB %lu) ",
                pgVar38->ctx->gen_ctx);
        MIR_output_insn(pMVar36,pgVar49->debug_file,(MIR_insn_t_conflict)pgVar50,
                        (pgVar49->curr_func_item->u).func,0);
        fwrite(":\n      ",8,1,(FILE *)pgVar49->debug_file);
        MIR_output_insn(pMVar36,pgVar49->debug_file,pMVar32,(pgVar49->curr_func_item->u).func,1);
        fwrite("      ",6,1,(FILE *)pgVar49->debug_file);
        MIR_output_insn(pMVar36,pgVar49->debug_file,insn,(pgVar49->curr_func_item->u).func,1);
      }
      gen_add_insn_before(pgVar49,(MIR_insn_t)pgVar50,pMVar32);
      gen_add_insn_before(pgVar49,(MIR_insn_t)pgVar50,insn);
      if (((FILE *)pgVar49->debug_file != (FILE *)0x0) && (1 < pgVar49->debug_level)) {
        fwrite("Changing ",9,1,(FILE *)pgVar49->debug_file);
        MIR_output_insn(pMVar36,pgVar49->debug_file,(MIR_insn_t_conflict)pgVar50,
                        (pgVar49->curr_func_item->u).func,0);
      }
      *(undefined4 *)&pgVar50->debug_file = 0;
      _MIR_new_var_op(pMVar36,MVar29);
      auVar4._16_16_ = auStack_1e0;
      auVar4._0_16_ = auStack_1f0;
      pgVar50->temp_bitmap3 = (bitmap_t)auStack_1e0._0_8_;
      pgVar50->call_used_hard_regs[0] = (bitmap_t)auStack_1e0._8_8_;
      pgVar50->call_used_hard_regs[1] = (bitmap_t)auStack_1d0._0_8_;
      pgVar50->call_used_hard_regs[2] = (bitmap_t)auStack_1d0._8_8_;
      *(undefined1 (*) [32])&pgVar50->temp_bitmap = auVar4;
      if (((FILE *)pgVar49->debug_file != (FILE *)0x0) && (1 < pgVar49->debug_level)) {
        fwrite(" to ",4,1,(FILE *)pgVar49->debug_file);
        MIR_output_insn(pMVar36,pgVar49->debug_file,(MIR_insn_t_conflict)pgVar50,
                        (pgVar49->curr_func_item->u).func,1);
      }
    }
    if (sStack_328 != 0) {
      uVar41 = *(int *)&pgVar50->debug_file - 0xaa;
      sVar59 = 0;
      pgStack_350 = (gen_ctx *)CONCAT44(pgStack_350._4_4_,uVar41);
      do {
        pDVar62 = pDStack_348 + sVar59 * 3;
        MVar27 = MIR_insn_op_mode(pMStack_338,(MIR_insn_t_conflict)pgVar50,sVar59,&iStack_354);
        if ((pgVar49->debug_file != (FILE *)0x0) && (1 < pgVar49->debug_level)) {
          pauVar34 = (undefined1 (*) [32])&pbStack_280;
          if (iStack_354 == 0) {
            pauVar34 = (undefined1 (*) [32])&pbStack_250;
          }
          auVar4 = *(undefined1 (*) [32])pDVar62;
          *(undefined1 (*) [32])(*pauVar34 + 0x10) = *(undefined1 (*) [32])(pDVar62 + 1);
          *pauVar34 = auVar4;
        }
        if (*(char *)&pDVar62->next == '\v') {
          if ((uVar41 < 0xfffffffd) ||
             (*(byte *)&((DLIST_in_edge_t *)(pDVar62 + 1))->head - 0x11 < 0xfffffffb)) {
            if (0x22 < *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar62 + 2))->head + 1) {
              MVar29 = change_reg(pgVar49,&MStack_320,
                                  *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar62 + 2))->head,base_reg,
                                  MIR_OP_INT,(MIR_insn_t)pgVar50,0);
              *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar62 + 2))->head = MVar29;
              if (MVar29 == 0xffffffff) {
                __assert_fail("op->u.var_mem.base != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fcc,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            MVar29 = *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar62 + 2))->head + 4);
            if (0x22 < MVar29 + 1) {
              MVar29 = change_reg(pgVar49,&MStack_320,MVar29,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar50
                                  ,0);
              *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar62 + 2))->head + 4) = MVar29;
              if (MVar29 == 0xffffffff) {
                __assert_fail("op->u.var_mem.index != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fd1,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
          }
        }
        else if ((*(char *)&pDVar62->next == '\x02') &&
                (0x21 < *(uint *)&((DLIST_in_edge_t *)(pDVar62 + 1))->head)) {
          if (MVar27 == MIR_OP_VAR) {
            if ((*(int *)&pgVar50->debug_file != 0xb9) &&
               ((sVar59 != 1 || (3 < *(int *)&pgVar50->debug_file - 0x1eU)))) goto LAB_0017219a;
            MVar28 = MIR_reg_type(pMStack_338,
                                  *(uint *)&((DLIST_in_edge_t *)(pDVar62 + 1))->head - 0x21,
                                  (pgVar49->curr_func_item->u).func);
            if (MVar28 == MIR_T_F) {
              MVar27 = MIR_OP_FLOAT;
            }
            else if (MVar28 == MIR_T_D) {
              MVar27 = MIR_OP_DOUBLE;
            }
            else {
              MVar27 = (uint)(MVar28 == MIR_T_LD) * 4 + MIR_OP_INT;
            }
          }
          pVVar15 = pgVar49->ra_ctx->reg_renumber;
          if (((pVVar15 == (VARR_MIR_reg_t *)0x0) || (pVVar15->varr == (MIR_reg_t *)0x0)) ||
             (pVVar15->els_num <= (ulong)*(uint *)&((DLIST_in_edge_t *)(pDVar62 + 1))->head)) {
LAB_001720e5:
            rewrite_insn_cold_18();
LAB_001720ed:
            __assert_fail("n < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ef5,
                          "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                         );
          }
          if (((sVar59 == 0) && (*(int *)&pgVar50->debug_file - 0x22U < 0xfffffffc)) &&
             (uVar45 = pVVar15->varr[*(uint *)&((DLIST_in_edge_t *)(pDVar62 + 1))->head],
             0x21 < uVar45)) {
            pMVar36 = pgVar49->ctx;
            MVar28 = MIR_reg_type(pMVar36,*(int *)&((DLIST_in_edge_t *)&pgVar50->addr_insn_p)->head
                                          - 0x21,(pgVar49->curr_func_item->u).func);
            uVar45 = uVar45 - 0x22;
            if (pgVar49->target_ctx->keep_fp_p == '\0') {
              disp = (ulong)uVar45 << 3;
            }
            else {
              lVar43 = -0xb0;
              if (((pgVar49->curr_func_item->u).func)->vararg_p == '\0') {
                lVar43 = 0;
              }
              disp = lVar43 + (ulong)((MVar28 == MIR_T_LD) + 1 + uVar45) * -8;
            }
            iVar26 = *(int *)&((DLIST_in_edge_t *)&pgVar50->addr_insn_p)->head;
            auVar4 = *(undefined1 (*) [32])pDStack_348;
            MStack_2b0.u._16_8_ = SUB328(*(undefined1 (*) [32])(pDStack_348 + 1),0x10);
            MStack_2b0.u.mem.disp = SUB328(*(undefined1 (*) [32])(pDStack_348 + 1),0x18);
            MStack_2b0.data._0_4_ = auVar4._0_4_;
            MStack_2b0.data._4_4_ = auVar4._4_4_;
            MStack_2b0._8_8_ = auVar4._8_8_;
            MStack_2b0.u.i = auVar4._16_8_;
            MStack_2b0.u.str.s = auVar4._24_8_;
            _MIR_new_var_mem_op(&MStack_2e0,pMVar36,MVar28,disp,base_reg,0xffffffff,'\0');
            pFVar18 = pgVar50->debug_file;
            if ((int)((ulong)pFVar18 >> 0x20) < 1) {
              uVar41 = 0;
            }
            else {
              uVar65 = 0;
              uVar41 = 0;
              pDVar39 = (DLIST_in_edge_t *)&pgVar50->addr_insn_p;
              do {
                if ((*(char *)&((DLIST_LINK_bb_t *)(pDVar39 + -1))->next == '\x02') &&
                   (*(int *)&pDVar39->head == iVar26)) {
                  auVar21._4_4_ = MStack_2e0.data._4_4_;
                  auVar21._0_4_ = (MIR_reg_t)MStack_2e0.data;
                  auVar21._8_8_ = MStack_2e0._8_8_;
                  auVar21._16_8_ = MStack_2e0.u.i;
                  auVar21._24_8_ = MStack_2e0.u.str.s;
                  auVar22._8_8_ = MStack_2e0.u.str.s;
                  auVar22._0_8_ = MStack_2e0.u.i;
                  auVar22._16_8_ = MStack_2e0.u._16_8_;
                  auVar22._24_8_ = MStack_2e0.u.mem.disp;
                  *(undefined1 (*) [32])pDVar39 = auVar22;
                  *(undefined1 (*) [32])(pDVar39 + -1) = auVar21;
                  if (1 < (int)uVar41) goto LAB_001720ed;
                  lVar43 = (long)(int)uVar41;
                  uVar41 = uVar41 + 1;
                  aiStack_220[lVar43] = (int)uVar65;
                }
                uVar65 = uVar65 + 1;
                pDVar39 = pDVar39 + 3;
              } while ((ulong)pFVar18 >> 0x20 != uVar65);
            }
            iVar26 = find_insn_pattern(pgVar49,(MIR_insn_t)pgVar50,(int *)0x0);
            if (0 < (int)uVar41 && iVar26 < 0) {
              uVar65 = 0;
              do {
                iVar25 = aiStack_220[uVar65];
                auVar23._4_4_ = MStack_2b0.data._4_4_;
                auVar23._0_4_ = (MIR_reg_t)MStack_2b0.data;
                auVar23._8_8_ = MStack_2b0._8_8_;
                auVar23._16_8_ = MStack_2b0.u.i;
                auVar23._24_8_ = MStack_2b0.u.str.s;
                auVar24._8_8_ = MStack_2b0.u.str.s;
                auVar24._0_8_ = MStack_2b0.u.i;
                auVar24._16_8_ = MStack_2b0.u._16_8_;
                auVar24._24_8_ = MStack_2b0.u.mem.disp;
                *(undefined1 (*) [32])(pDStack_348 + (long)iVar25 * 3 + 1) = auVar24;
                *(undefined1 (*) [32])(pDStack_348 + (long)iVar25 * 3) = auVar23;
                uVar65 = uVar65 + 1;
              } while (uVar41 != uVar65);
            }
            uVar41 = (uint)pgStack_350;
            if (-1 < iVar26) goto LAB_00171ebc;
          }
          MVar29 = change_reg(pgVar49,&MStack_320,
                              *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar62 + 1))->head,base_reg,
                              MVar27,(MIR_insn_t)pgVar50,iStack_354);
          if (MVar29 == 0xffffffff) {
            auVar19._8_8_ = MStack_320._8_8_;
            auVar19._0_8_ = MStack_320.data;
            auVar19._16_8_ = MStack_320.u.i;
            auVar19._24_8_ = MStack_320.u.str.s;
            auVar20._8_8_ = MStack_320.u.str.s;
            auVar20._0_8_ = MStack_320.u.i;
            auVar20._16_8_ = MStack_320.u._16_8_;
            auVar20._24_8_ = MStack_320.u.mem.disp;
            *(undefined1 (*) [32])(pDVar62 + 1) = auVar20;
            *(undefined1 (*) [32])pDVar62 = auVar19;
          }
          else {
            *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar62 + 1))->head = MVar29;
          }
        }
LAB_00171ebc:
        sVar59 = sVar59 + 1;
      } while (sVar59 != sStack_328);
    }
    pDVar62 = pDStack_348;
    if ((((ulong)pgVar50->debug_file & 0xfffffffc) == 0) &&
       (op1_00._12_4_ = (int)((ulong)pgVar50->to_free >> 0x20),
       op1_00._0_12_ = *(undefined1 (*) [12])&pgVar50->debug_level,
       op1_00.u.i = (int64_t)((DLIST_in_edge_t *)&pgVar50->addr_insn_p)->head,
       op1_00.u.mem.nonalias = (int)(in_edge_t_conflict)pgVar50->tied_regs,
       op1_00.u.mem.nloc = (int)((ulong)pgVar50->tied_regs >> 0x20),
       op1_00.u._16_8_ = ((DLIST_out_edge_t *)&pgVar50->addr_regs)->head,
       op1_00.u.mem.disp = (MIR_disp_t)pgVar50->insn_to_consider,
       iVar26 = MIR_op_eq_p(pMStack_338,op1_00,*(MIR_op_t *)&pgVar50->temp_bitmap), iVar26 != 0)) {
      if (((FILE *)pgVar49->debug_file != (FILE *)0x0) && (1 < pgVar49->debug_level)) {
        fwrite("Deleting noop move ",0x13,1,(FILE *)pgVar49->debug_file);
        pMVar36 = pMStack_338;
        MIR_output_insn(pMStack_338,pgVar49->debug_file,(MIR_insn_t_conflict)pgVar50,
                        (pgVar49->curr_func_item->u).func,0);
        fwrite(" which was ",0xb,1,(FILE *)pgVar49->debug_file);
        ((DLIST_in_edge_t *)(pDVar62 + 1))->head = peStack_270;
        ((DLIST_in_edge_t *)(pDVar62 + 1))->tail = peStack_268;
        ((DLIST_out_edge_t *)(pDVar62 + 2))->head = peStack_260;
        ((DLIST_out_edge_t *)(pDVar62 + 2))->tail = peStack_258;
        pDVar62->prev = pbStack_280;
        pDVar62->next = pbStack_278;
        ((DLIST_in_edge_t *)(pDVar62 + 1))->head = peStack_270;
        ((DLIST_in_edge_t *)(pDVar62 + 1))->tail = peStack_268;
        pgVar50->temp_bitmap3 = pVStack_240;
        pgVar50->call_used_hard_regs[0] = pVStack_238;
        pgVar50->call_used_hard_regs[1] = pVStack_230;
        pgVar50->call_used_hard_regs[2] = pVStack_228;
        ((DLIST_bb_insn_t *)&pgVar50->temp_bitmap)->head = pbStack_250;
        pgVar50->temp_bitmap2 = (bitmap_t)pbStack_248;
        pgVar50->temp_bitmap3 = pVStack_240;
        pgVar50->call_used_hard_regs[0] = pVStack_238;
        MIR_output_insn(pMVar36,pgVar49->debug_file,(MIR_insn_t_conflict)pgVar50,
                        (pgVar49->curr_func_item->u).func,1);
      }
      if ((((pgVar49->optimize_level != 0) &&
           (pMVar36 = pgVar50->ctx, pMVar36 != (MIR_context_t)0x0)) &&
          ((MIR_context_t)pMVar36->temp_string[3].size == pMVar36)) &&
         ((MIR_context_t)pMVar36->temp_string[3].varr == pMVar36)) {
        pMVar32 = MIR_new_insn_arr(pgVar49->ctx,MIR_USE,0,(MIR_op_t *)0x0);
        MIR_insert_insn_before
                  (pgVar49->ctx,pgVar49->curr_func_item,(MIR_insn_t_conflict)pMVar36->gen_ctx,
                   pMVar32);
        add_new_bb_insn(pgVar49,pMVar32,(bb_t_conflict)pMVar36->temp_string,0);
      }
      gen_delete_insn(pgVar49,(MIR_insn_t)pgVar50);
    }
    return;
  }
  if ((int)(uStack_37c & uStack_33c) < 0) {
    __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
  }
  pMVar36 = pgVar49->ctx;
  uVar41 = uStack_37c;
  if (-1 < (int)uStack_33c) {
    uVar41 = uStack_33c;
  }
  lVar43 = (long)(int)uVar41;
  uVar41 = *(uint *)&pDStack_348[lVar43 * 3 + 2].prev;
  uVar51 = (ulong)*(uint *)((long)&pDStack_348[lVar43 * 3 + 2].prev + 4);
  uVar65 = (ulong)uStack_37c;
  uVar31 = (ulong)uStack_33c;
  if (-1 < (int)(uStack_37c | uStack_33c)) {
    pDVar62 = pDStack_348 + uVar65 * 3;
    op1._12_4_ = (int)((ulong)pDVar62->next >> 0x20);
    op1._0_12_ = *(undefined1 (*) [12])pDVar62;
    op1.u.i = (int64_t)((DLIST_in_edge_t *)(pDVar62 + 1))->head;
    op1.u.mem.nonalias = (int)((DLIST_in_edge_t *)(pDVar62 + 1))->tail;
    op1.u.mem.nloc = (int)((ulong)((DLIST_in_edge_t *)(pDVar62 + 1))->tail >> 0x20);
    op1.u._16_8_ = pDStack_348[uVar65 * 3 + 2].prev;
    op1.u.mem.disp = (MIR_disp_t)pDStack_348[uVar65 * 3 + 2].next;
    op2.u._16_8_ = pDStack_348[uVar31 * 3 + 2].prev;
    op2._0_32_ = *(undefined1 (*) [32])(pDStack_348 + uVar31 * 3);
    op2.u.mem.disp = (MIR_disp_t)pDStack_348[uVar31 * 3 + 2].next;
    iVar26 = MIR_op_eq_p(pMVar36,op1,op2);
    if (iVar26 == 0) {
      __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
  }
  pVVar15 = pgVar49->ra_ctx->reg_renumber;
  if (((pVVar15 == (VARR_MIR_reg_t *)0x0) || (pVVar15->varr == (MIR_reg_t *)0x0)) ||
     (pVVar15->els_num <= (ulong)uVar41)) {
    rewrite_insn_cold_20();
  }
  else {
    add_ld_st(pgVar49,&MStack_2b0,pVVar15->varr[uVar41],base_reg,MIR_OP_INT,10,0,10,
              (MIR_insn_t)pgVar50,0);
    pDVar62 = pDStack_348;
    pVVar15 = pgVar49->ra_ctx->reg_renumber;
    if (((pVVar15 != (VARR_MIR_reg_t *)0x0) && (pVVar15->varr != (MIR_reg_t *)0x0)) &&
       (uVar51 < pVVar15->els_num)) {
      add_ld_st(pgVar49,&MStack_2b0,pVVar15->varr[uVar51],base_reg,MIR_OP_INT,0xb,0,0xb,
                (MIR_insn_t)pgVar50,0);
      _MIR_new_var_op(pMVar36,10);
      _MIR_new_var_op(pMVar36,0xb);
      bVar5 = *(byte *)((long)&pDVar62[lVar43 * 3 + 1].prev + 1);
      uVar51 = (ulong)bVar5;
      if (bVar5 == 0) {
        iVar33 = -1;
LAB_00171476:
        MIR_new_int_op(pMVar36,iVar33);
        pMVar32 = MIR_new_insn(pMVar36,MIR_LSH);
        gen_add_insn_before(pgVar49,(MIR_insn_t)pgVar50,pMVar32);
        if (((FILE *)pgVar49->debug_file != (FILE *)0x0) && (1 < pgVar49->debug_level)) {
          fwrite("      ",6,1,(FILE *)pgVar49->debug_file);
          MIR_output_insn(pMVar36,pgVar49->debug_file,pMVar32,(pgVar49->curr_func_item->u).func,1);
        }
      }
      else if (bVar5 != 1) {
        lVar43 = 0;
        uVar37 = uVar51;
        if ((bVar5 & 1) == 0) {
          do {
            lVar43 = lVar43 + 1;
            uVar51 = uVar37 >> 1;
            uVar58 = uVar37 & 2;
            uVar37 = uVar51;
          } while (uVar58 == 0);
        }
        iVar33 = -1;
        if (uVar51 == 1) {
          iVar33 = lVar43;
        }
        goto LAB_00171476;
      }
      pMVar32 = MIR_new_insn(pMVar36,MIR_ADD);
      gen_add_insn_before(pgVar49,(MIR_insn_t)pgVar50,pMVar32);
      if (((FILE *)pgVar49->debug_file != (FILE *)0x0) && (1 < pgVar49->debug_level)) {
        fwrite("      ",6,1,(FILE *)pgVar49->debug_file);
        MIR_output_insn(pMVar36,pgVar49->debug_file,pMVar32,(pgVar49->curr_func_item->u).func,1);
      }
      if (-1 < (int)uStack_33c) {
        pDStack_348[uVar31 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      if (-1 < (int)uStack_37c) {
        pDStack_348[uVar65 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      get_reload_hreg(pgVar49,0xffffffff,6,0);
      goto LAB_0017165a;
    }
  }
  rewrite_insn_cold_19();
LAB_00172195:
  rewrite_insn_cold_17();
LAB_0017219a:
  __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1fb5,"int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
  ;
}

Assistant:

static void setup_used_hard_regs (gen_ctx_t gen_ctx, MIR_type_t type, MIR_reg_t hard_reg) {
  MIR_reg_t curr_hard_reg;
  int i, slots_num = target_locs_num (hard_reg, type);

  for (i = 0; i < slots_num; i++)
    if ((curr_hard_reg = target_nth_loc (hard_reg, type, i)) <= MAX_HARD_REG)
      bitmap_set_bit_p (func_used_hard_regs, curr_hard_reg);
}